

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86instapi.cpp
# Opt level: O3

Error asmjit::v1_14::x86::InstInternal::validate
                (Mode mode,BaseInst *inst,Operand_ *operands,size_t opCount,
                ValidationFlags validationFlags)

{
  byte bVar1;
  uint32_t uVar2;
  BaseInst *pBVar3;
  bool bVar4;
  byte bVar5;
  uint uVar6;
  Error EVar7;
  InstInfo *pIVar8;
  ulong uVar9;
  OpSignature *pOVar10;
  ulong extraout_RAX;
  uint uVar11;
  ValidationFlags validationFlags_00;
  uint uVar12;
  size_t opCount_00;
  undefined1 *puVar13;
  uint uVar14;
  undefined1 *puVar15;
  uint uVar16;
  undefined7 in_register_00000039;
  Operand_ *pOVar17;
  ulong uVar18;
  uint uVar19;
  ulong uVar20;
  uint uVar22;
  byte bVar23;
  InstSignature *this;
  undefined1 *puVar24;
  Operand_ *pOStack_c0;
  bool localImmOutOfRange;
  uint local_b4;
  Operand_ *local_b0;
  undefined1 *local_a8;
  ulong local_a0;
  Operand_ *local_98;
  InstSignature *local_90;
  undefined1 *local_88;
  uint local_80;
  uint local_7c;
  uint local_78;
  uint local_74;
  BaseInst *local_70;
  OpSignature oSigTranslated [6];
  ulong uVar21;
  
  local_90 = (InstSignature *)CONCAT44(local_90._4_4_,validationFlags);
  local_b4 = (uint)CONCAT71(in_register_00000039,mode);
  local_88 = _x64ValidationData;
  if (local_b4 == 1) {
    local_88 = _x86ValidationData;
  }
  if (*(uint *)inst < 0x6bb) {
    uVar14 = *(uint *)(inst + 4);
    pIVar8 = InstDB::infoById((InstDB *)(ulong)*(uint *)inst,(InstId)inst);
    local_a0 = (ulong)(*(uint *)pIVar8 >> 0xe & 0x3ff);
    local_80 = *(uint *)(InstDB::_commonInfoTable + local_a0 * 8);
    if ((uVar14 & 0x32000) != 0) {
      if ((uVar14 >> 0xd & 1) == 0) {
        if ((uVar14 & 0x30000) != 0) {
LAB_00143fd8:
          pOStack_c0 = (Operand_ *)0x20;
          goto LAB_001448e5;
        }
      }
      else {
        pOStack_c0 = (Operand_ *)0x21;
        if ((local_80 >> 0x10 & 1) == 0) {
          if ((opCount == 0) || ((uVar14 & 0x30000) == 0)) goto LAB_001448e5;
        }
        else if (opCount == 0) goto LAB_001448e5;
        if (((operands->_signature)._bits & 7) != 2) goto LAB_001448e5;
        if ((uVar14 & 0x30000) != 0) {
          if ((uVar14 & 0x30000) == 0x30000) goto LAB_00143fd8;
          if (((uVar14 >> 0x10 & 1) != 0) && ((local_80 & 0x20000) == 0)) {
            pOStack_c0 = (Operand_ *)0x22;
            goto LAB_001448e5;
          }
          if (((uVar14 >> 0x11 & 1) != 0) && ((local_80 & 0x40000) == 0)) {
            pOStack_c0 = (Operand_ *)0x23;
            goto LAB_001448e5;
          }
        }
      }
    }
    local_7c = uVar14 & 0xc000;
    if (local_7c != 0) {
      pOStack_c0 = (Operand_ *)0x20;
      if (local_7c == 0xc000) goto LAB_001448e5;
      if ((local_80 >> 0xe & 1) == 0) {
        pOStack_c0 = (Operand_ *)0x24;
        goto LAB_001448e5;
      }
    }
    local_74 = 0xc6;
    if ((char)local_b4 == '\x01') {
      local_74 = 0x66;
    }
    uVar6 = 0x70c0;
    if ((char)local_b4 == '\x01') {
      uVar6 = 0x7060;
    }
    uVar9 = 0;
    local_b0 = (Operand_ *)0x0;
    uVar16 = 0;
    for (uVar11 = 0; puVar13 = (undefined1 *)(ulong)uVar11, puVar24 = (undefined1 *)opCount,
        puVar13 < opCount; uVar11 = uVar11 + 1) {
      uVar12 = operands[(long)puVar13]._signature._bits;
      if (5 < (uVar12 & 7)) {
switchD_00144103_caseD_3:
        pOStack_c0 = (Operand_ *)0x3;
        goto LAB_001448e5;
      }
      pOVar17 = operands + (long)puVar13;
      uVar21 = 0;
      uVar20 = 0;
      switch(uVar12 & 7) {
      case 0:
        pOVar17 = operands + opCount;
        puVar15 = (undefined1 *)opCount;
        goto LAB_0014476a;
      case 1:
        uVar12 = uVar12 >> 3 & 0x1f;
        if ((0xfe018f07U >> uVar12 & 1) == 0) {
          uVar18 = *(ulong *)(_x86OpFlagFromRegType + (ulong)uVar12 * 8);
          uVar22 = pOVar17->_baseId;
          if (uVar22 < 0x100) {
            if (uVar22 < 0x20) {
              uVar19 = 1 << ((byte)uVar22 & 0x1f);
              uVar20 = (ulong)uVar19;
              if ((*(uint *)(local_88 + (ulong)uVar12 * 4) >> (uVar22 & 0x1f) & 1) != 0) {
                uVar16 = uVar16 | uVar19;
                break;
              }
            }
LAB_001448c6:
            pOStack_c0 = (Operand_ *)0x1d;
          }
          else {
            uVar20 = 0xffffffff;
            if (((ulong)local_90 & 1) != 0) break;
LAB_0014478f:
            pOStack_c0 = (Operand_ *)0x3e;
          }
        }
        else {
          pOStack_c0 = (Operand_ *)0x1b;
        }
        goto LAB_001448e5;
      case 2:
        if ((~uVar12 & 0x1c0000) == 0) {
          pOStack_c0 = (Operand_ *)0x31;
          goto LAB_001448e5;
        }
        uVar22 = uVar12 >> 0x18;
        if ((uVar12 & 0xe00000) != 0) {
          uVar19 = *(uint *)(InstDB::_commonInfoTable + local_a0 * 8 + 4);
          if (uVar12 < 0x1000000) {
            uVar22 = 8;
            if ((uVar19 & 0x40) == 0) {
              uVar22 = ((uVar19 & 0x20) >> 4) + 2;
            }
          }
          else if (((uVar22 != 4) && ((uVar19 & 0x20) != 0)) ||
                  ((uVar22 != 8 && ((uVar19 & 0x40) != 0)))) {
            pOStack_c0 = (Operand_ *)0x29;
            goto LAB_001448e5;
          }
          uVar22 = uVar22 << ((byte)(uVar12 >> 0x15) & 7);
        }
        bVar5 = (byte)uVar12;
        bVar23 = (byte)(uVar12 >> 8) & 0x1f;
        if (bVar5 < 8) {
          uVar2 = pOVar17->_baseId;
          if ((long)(int)pOVar17->_data[1] == CONCAT44(uVar2,pOVar17->_data[1])) {
LAB_001442fc:
            if ((uVar12 & 0x1f00) != 0) {
LAB_00144376:
              if ((uVar6 >> (uVar12 >> 8 & 0x1f) & 1) == 0) goto LAB_001447e9;
              bVar23 = bVar23 - 0xc;
              if (bVar23 < 3) {
                uVar18 = *(ulong *)(&DAT_001623e0 + (ulong)bVar23 * 8);
LAB_001443b9:
                if ((bVar5 >> 3 == 2) && ((uVar18 & 0xfc0000000) != 0)) goto LAB_001447e9;
              }
              else {
                uVar18 = 0x8000000000000;
                if (7 < bVar5) goto LAB_001443b9;
                uVar18 = 0;
              }
              uVar12 = pOVar17->_data[0];
              if (uVar12 < 0x100) {
                if (0x1f < uVar12) goto LAB_001448c6;
                uVar16 = uVar16 | 1 << (uVar12 & 0x1f);
                uVar20 = 0;
              }
              else {
                uVar20 = 0;
                if (((ulong)local_90 & 1) == 0) goto LAB_0014478f;
              }
              goto LAB_00144442;
            }
          }
          else {
            if ((char)local_b4 == '\x01') {
              if (uVar2 != 0) goto LAB_001448a1;
              goto LAB_001442fc;
            }
            if ((uVar12 & 0x1f00) != 0) {
              if (uVar2 == 0) {
                if (bVar23 == 6) goto LAB_00144376;
                pOStack_c0 = (Operand_ *)0x2f;
              }
              else {
LAB_001448a1:
                pOStack_c0 = (Operand_ *)0x2e;
              }
              goto LAB_001448e5;
            }
          }
          uVar18 = 0;
          uVar20 = 0;
        }
        else {
          if (bVar5 < 0x10) goto LAB_001442fc;
          uVar19 = pOVar17->_baseId;
          if (((uVar12 >> 0xd & 1) == 0) && ((local_74 >> (bVar5 >> 3) & 1) == 0)) {
LAB_001447e9:
            pOStack_c0 = (Operand_ *)0x2b;
            goto LAB_001448e5;
          }
          if (uVar19 < 0x100) {
            if (0x1f < uVar19) goto LAB_001448c6;
            uVar20 = (ulong)(uint)(1 << ((byte)uVar19 & 0x1f));
            uVar16 = uVar16 | 1 << (uVar19 & 0x1f);
          }
          else {
            uVar20 = 0xffffffff;
            if (((ulong)local_90 & 1) == 0) goto LAB_0014478f;
          }
          if ((uVar12 & 0x1f00) != 0) goto LAB_00144376;
          uVar18 = (ulong)(pOVar17->_data[1] == 0) << 0x30;
        }
LAB_00144442:
        local_b0 = pOVar17;
        switch(uVar22) {
        case 0:
          uVar18 = uVar18 | 0x40000;
          break;
        case 1:
          uVar18 = uVar18 | 0x80000;
          break;
        case 2:
          uVar18 = uVar18 | 0x100000;
          break;
        case 3:
        case 5:
        case 7:
        case 9:
        case 0xb:
        case 0xc:
        case 0xd:
        case 0xe:
        case 0xf:
switchD_00144459_caseD_3:
          pOStack_c0 = (Operand_ *)0x33;
          goto LAB_001448e5;
        case 4:
          uVar18 = uVar18 | 0x200000;
          break;
        case 6:
          uVar18 = uVar18 | 0x400000;
          break;
        case 8:
          uVar18 = uVar18 | 0x800000;
          break;
        case 10:
          uVar18 = uVar18 | 0x1000000;
          break;
        case 0x10:
          uVar18 = uVar18 | 0x2000000;
          break;
        default:
          if (uVar22 == 0x20) {
            uVar18 = uVar18 | 0x4000000;
          }
          else {
            if (uVar22 != 0x40) goto switchD_00144459_caseD_3;
            uVar18 = uVar18 | 0x8000000;
          }
        }
        break;
      case 3:
        goto switchD_00144103_caseD_3;
      case 4:
        uVar18 = *(ulong *)pOVar17->_data;
        if ((long)((ulong)pOVar17->_data[1] << 0x20) < 0) {
          uVar18 = -uVar18;
          if (uVar18 < 9) {
            uVar18 = 0x155000000000;
          }
          else if (uVar18 < 0x81) {
            uVar18 = 0x154000000000;
          }
          else if (uVar18 < 0x8001) {
            uVar18 = 0x150000000000;
          }
          else {
            uVar18 = ((ulong)(uVar18 < 0x80000001) | 4) << 0x2a;
          }
        }
        else if (uVar18 < 8) {
          uVar18 = 0x3ff000000000;
          uVar20 = uVar21;
        }
        else if (uVar18 < 0x10) {
          uVar18 = 0x3fe000000000;
          uVar20 = uVar21;
        }
        else if (uVar18 < 0x80) {
          uVar18 = 0x3fc000000000;
        }
        else if (uVar18 < 0x100) {
          uVar18 = 0x3f8000000000;
        }
        else if (uVar18 < 0x8000) {
          uVar18 = 0x3f0000000000;
        }
        else if (uVar18 < 0x10000) {
          uVar18 = 0x3e0000000000;
        }
        else if (uVar18 < 0x80000000) {
          uVar18 = 0x3c0000000000;
        }
        else {
          uVar18 = ((ulong)(pOVar17->_data[1] == 0) | 6) << 0x2b;
        }
        break;
      case 5:
        uVar18 = 0xc00000000000;
        uVar20 = uVar21;
      }
      oSigTranslated[(long)puVar13] = (OpSignature)(uVar20 << 0x38 | uVar18 & 0xffffffffffffff);
      uVar9 = uVar9 | uVar18;
    }
LAB_00144575:
    if ((char)local_b4 == '\x01') {
      if ((uVar9 & 0x10) != 0) {
        pOStack_c0 = (Operand_ *)0x3a;
        goto LAB_001448e5;
      }
    }
    else if (((byte)(0xff < uVar16 | ((byte)inst[7] & 0x40) >> 6) == 1) && ((uVar9 & 2) != 0)) {
      pOStack_c0 = (Operand_ *)0x39;
      goto LAB_001448e5;
    }
    uVar6 = *(uint *)(InstDB::_commonInfoTable + local_a0 * 8 + 4) >> 0x16 & 0x1f;
    local_a8 = (undefined1 *)opCount;
    local_98 = operands;
    local_78 = uVar14;
    local_70 = inst;
    if (uVar6 != 0) {
      this = (InstSignature *)
             (InstDB::_instSignatureTable +
             (*(uint *)(InstDB::_commonInfoTable + local_a0 * 8 + 4) >> 8 & 0x3ff8));
      local_90 = this + uVar6;
      uVar14 = local_b4 & 0xffffff03;
      bVar23 = 0;
      bVar5 = 0;
      local_b4 = uVar14;
      local_a8 = puVar24;
      do {
        bVar1 = *(byte *)this;
        if ((byte)((byte)uVar14 & bVar1 >> 3) != 0) {
          uVar6 = bVar1 & 7;
          localImmOutOfRange = false;
          if (puVar24 == (undefined1 *)(ulong)uVar6) {
            for (puVar13 = (undefined1 *)0x0; (uint)puVar13 < (uint)puVar24; puVar13 = puVar13 + 1)
            {
              pOVar10 = InstDB::InstSignature::opSignature(this,(size_t)puVar13);
              bVar4 = x86CheckOSig((OpSignature *)oSigTranslated[(long)puVar13],
                                   (OpSignature *)*pOVar10,&localImmOutOfRange);
              if (!bVar4) break;
            }
          }
          else {
            puVar13 = (undefined1 *)0x0;
            if (puVar24 == (undefined1 *)(ulong)(uVar6 - (bVar1 >> 5))) {
              puVar13 = (undefined1 *)0x0;
              uVar11 = 0;
              while ((puVar24 = local_a8, uVar14 = local_b4, puVar13 < local_a8 && (uVar11 < uVar6))
                    ) {
                puVar15 = (undefined1 *)(ulong)uVar11;
                local_88 = puVar13;
                while( true ) {
                  bVar5 = InstDB::InstSignature::opSignatureIndex(this,(size_t)puVar15);
                  if (((ulong)*(OpSignature **)(InstDB::_opSignatureTable + (ulong)bVar5 * 8) >>
                       0x37 & 1) == 0) break;
                  puVar15 = puVar15 + 1;
                  puVar24 = local_a8;
                  uVar14 = local_b4;
                  if ((undefined1 *)(ulong)uVar6 <= puVar15) goto LAB_001446d4;
                }
                bVar4 = x86CheckOSig((OpSignature *)oSigTranslated[(long)local_88],
                                     *(OpSignature **)(InstDB::_opSignatureTable + (ulong)bVar5 * 8)
                                     ,&localImmOutOfRange);
                puVar24 = local_a8;
                uVar14 = local_b4;
                if (!bVar4) break;
                puVar13 = (undefined1 *)(ulong)((int)puVar13 + 1);
                uVar11 = (int)puVar15 + 1;
              }
            }
          }
LAB_001446d4:
          bVar4 = puVar24 == (undefined1 *)((ulong)puVar13 & 0xffffffff);
          bVar5 = bVar23;
          if (bVar4) {
            bVar5 = localImmOutOfRange;
          }
          bVar23 = bVar5;
          if ((localImmOutOfRange & 1U) == 0 && bVar4) {
            if (this != local_90) goto LAB_0014471a;
            break;
          }
        }
        this = this + 1;
      } while (this != local_90);
      pOStack_c0 = (Operand_ *)0x1a;
      if ((bVar5 & 1) != 0) {
        pOStack_c0 = (Operand_ *)0x32;
      }
      goto LAB_001448e5;
    }
LAB_0014471a:
    pBVar3 = local_70;
    if ((local_78 & 0x8c0000) != 0) {
      if ((InstDB::_commonInfoTable[local_a0 * 8 + 2] & 0x80) == 0) goto LAB_00144747;
      if (((local_78 >> 0x17 & 1) != 0) && ((InstDB::_commonInfoTable[local_a0 * 8 + 4] & 2) == 0))
      {
        pOStack_c0 = (Operand_ *)0x28;
        goto LAB_001448e5;
      }
      if ((local_78 & 0xc0000) != 0) {
        pOStack_c0 = (Operand_ *)0x2a;
        if (local_b0 != (Operand_ *)0x0) goto LAB_001448e5;
        validationFlags_00 = 0x15ae60;
        uVar14 = *(uint *)(InstDB::_commonInfoTable + local_a0 * 8 + 4);
        if ((local_78 >> 0x12 & 1) == 0) {
          uVar6 = uVar14 & 8;
        }
        else {
          uVar6 = uVar14 & 4;
        }
        if (uVar6 == 0) goto LAB_001448e5;
        if ((uVar14 & 0x70) != 0) {
          if (puVar24 < (undefined1 *)0x2) {
            pOVar17 = local_98;
            validate();
            EVar7 = validate(kX64,(BaseInst *)pOVar17,pOStack_c0,opCount_00,validationFlags_00);
            return EVar7;
          }
          validate((InstInternal *)local_98);
          pOStack_c0 = (Operand_ *)0x2a;
          if ((extraout_RAX & 1) == 0) goto LAB_001448e5;
        }
      }
    }
    uVar14 = *(uint *)(pBVar3 + 8);
    pOStack_c0 = (Operand_ *)0x0;
    if (uVar14 != 0) {
      if (local_7c == 0) {
        pOStack_c0 = (Operand_ *)0x26;
        if ((((uVar14 & 0xf8) == 0x88) &&
            ((*(uint *)(InstDB::_commonInfoTable + local_a0 * 8) & 0x800000) != 0)) &&
           ((*(int *)(pBVar3 + 0xc) == 0 ||
            (pOStack_c0 = (Operand_ *)0x0, (InstDB::_commonInfoTable[local_a0 * 8 + 4] & 1) == 0))))
        {
          pOStack_c0 = (Operand_ *)0x27;
        }
      }
      else if (((((short)local_80 < 0) ||
                (*(uint *)(pBVar3 + 0xc) < 0xff && *(uint *)(pBVar3 + 0xc) != 1)) ||
               (local_b0 == (Operand_ *)0x0)) ||
              (pOStack_c0 = (Operand_ *)0x0, ((uVar14 ^ (local_b0->_signature)._bits) & 0xf8) != 0))
      {
        pOStack_c0 = (Operand_ *)0x26;
      }
    }
  }
  else {
LAB_00144747:
    pOStack_c0 = (Operand_ *)0x1a;
  }
LAB_001448e5:
  return (Error)pOStack_c0;
  while (pOStack_c0 = (Operand_ *)0x1a, (pOVar17->_signature)._bits == 0) {
LAB_0014476a:
    pOVar17 = pOVar17 + -1;
    puVar15 = puVar15 + -1;
    puVar24 = puVar13;
    if (puVar15 <= puVar13) goto LAB_00144575;
  }
  goto LAB_001448e5;
}

Assistant:

static ASMJIT_FAVOR_SIZE Error validate(InstDB::Mode mode, const BaseInst& inst, const Operand_* operands, size_t opCount, ValidationFlags validationFlags) noexcept {
  uint32_t i;

  // Get the instruction data.
  const X86ValidationData* vd = (mode == InstDB::Mode::kX86) ? &_x86ValidationData : &_x64ValidationData;
  InstId instId = inst.id();
  InstOptions options = inst.options();

  if (ASMJIT_UNLIKELY(!Inst::isDefinedId(instId)))
    return DebugUtils::errored(kErrorInvalidInstruction);

  const InstDB::InstInfo& instInfo = InstDB::infoById(instId);
  const InstDB::CommonInfo& commonInfo = instInfo.commonInfo();

  InstDB::InstFlags iFlags = instInfo.flags();

  constexpr InstOptions kRepAny = InstOptions::kX86_Rep | InstOptions::kX86_Repne;
  constexpr InstOptions kXAcqXRel = InstOptions::kX86_XAcquire | InstOptions::kX86_XRelease;
  constexpr InstOptions kAvx512Options = InstOptions::kX86_ZMask | InstOptions::kX86_ER | InstOptions::kX86_SAE;

  // Validate LOCK|XACQUIRE|XRELEASE Prefixes
  // ----------------------------------------

  if (Support::test(options, InstOptions::kX86_Lock | kXAcqXRel)) {
    if (Support::test(options, InstOptions::kX86_Lock)) {
      if (ASMJIT_UNLIKELY(!Support::test(iFlags, InstDB::InstFlags::kLock) && !Support::test(options, kXAcqXRel)))
        return DebugUtils::errored(kErrorInvalidLockPrefix);

      if (ASMJIT_UNLIKELY(opCount < 1 || !operands[0].isMem()))
        return DebugUtils::errored(kErrorInvalidLockPrefix);
    }

    if (Support::test(options, kXAcqXRel)) {
      if (ASMJIT_UNLIKELY(!Support::test(options, InstOptions::kX86_Lock) || (options & kXAcqXRel) == kXAcqXRel))
        return DebugUtils::errored(kErrorInvalidPrefixCombination);

      if (ASMJIT_UNLIKELY(Support::test(options, InstOptions::kX86_XAcquire) && !Support::test(iFlags, InstDB::InstFlags::kXAcquire)))
        return DebugUtils::errored(kErrorInvalidXAcquirePrefix);

      if (ASMJIT_UNLIKELY(Support::test(options, InstOptions::kX86_XRelease) && !Support::test(iFlags, InstDB::InstFlags::kXRelease)))
        return DebugUtils::errored(kErrorInvalidXReleasePrefix);
    }
  }

  // Validate REP and REPNE Prefixes
  // -------------------------------

  if (Support::test(options, kRepAny)) {
    if (ASMJIT_UNLIKELY((options & kRepAny) == kRepAny))
      return DebugUtils::errored(kErrorInvalidPrefixCombination);

    if (ASMJIT_UNLIKELY(!Support::test(iFlags, InstDB::InstFlags::kRep)))
      return DebugUtils::errored(kErrorInvalidRepPrefix);
  }

  // Translate Each Operand to the Corresponding OpSignature
  // -------------------------------------------------------

  InstDB::OpSignature oSigTranslated[Globals::kMaxOpCount];
  InstDB::OpFlags combinedOpFlags = InstDB::OpFlags::kNone;
  uint32_t combinedRegMask = 0;
  const Mem* memOp = nullptr;

  for (i = 0; i < opCount; i++) {
    const Operand_& op = operands[i];
    if (op.opType() == OperandType::kNone)
      break;

    InstDB::OpFlags opFlags = InstDB::OpFlags::kNone;
    RegMask regMask = 0;

    switch (op.opType()) {
      case OperandType::kReg: {
        RegType regType = op.as<BaseReg>().type();
        opFlags = _x86OpFlagFromRegType[size_t(regType)];

        if (ASMJIT_UNLIKELY(opFlags == InstDB::OpFlags::kNone))
          return DebugUtils::errored(kErrorInvalidRegType);

        // If `regId` is equal or greater than Operand::kVirtIdMin it means that the register is virtual and its
        // index will be assigned later by the register allocator. We must pass unless asked to disallow virtual
        // registers.
        uint32_t regId = op.id();
        if (regId < Operand::kVirtIdMin) {
          if (ASMJIT_UNLIKELY(regId >= 32))
            return DebugUtils::errored(kErrorInvalidPhysId);

          if (ASMJIT_UNLIKELY(Support::bitTest(vd->allowedRegMask[size_t(regType)], regId) == 0))
            return DebugUtils::errored(kErrorInvalidPhysId);

          regMask = Support::bitMask(regId);
          combinedRegMask |= regMask;
        }
        else {
          if (uint32_t(validationFlags & ValidationFlags::kEnableVirtRegs) == 0)
            return DebugUtils::errored(kErrorIllegalVirtReg);
          regMask = 0xFFFFFFFFu;
        }
        break;
      }

      // TODO: Validate base and index and combine these with `combinedRegMask`.
      case OperandType::kMem: {
        const Mem& m = op.as<Mem>();
        memOp = &m;

        uint32_t memSize = m.size();
        RegType baseType = m.baseType();
        RegType indexType = m.indexType();

        if (m.segmentId() > 6)
          return DebugUtils::errored(kErrorInvalidSegment);

        // Validate AVX-512 broadcast {1tox}.
        if (m.hasBroadcast()) {
          if (memSize != 0) {
            // If the size is specified it has to match the broadcast size.
            if (ASMJIT_UNLIKELY(commonInfo.hasAvx512B32() && memSize != 4))
              return DebugUtils::errored(kErrorInvalidBroadcast);

            if (ASMJIT_UNLIKELY(commonInfo.hasAvx512B64() && memSize != 8))
              return DebugUtils::errored(kErrorInvalidBroadcast);
          }
          else {
            // If there is no size we implicitly calculate it so we can validate N in {1toN} properly.
            memSize = commonInfo.hasAvx512B64() ? 8 :
                      commonInfo.hasAvx512B32() ? 4 : 2;
          }

          memSize <<= uint32_t(m.getBroadcast());
        }

        if (baseType != RegType::kNone && baseType > RegType::kLabelTag) {
          uint32_t baseId = m.baseId();

          if (m.isRegHome()) {
            // Home address of a virtual register. In such case we don't want to validate the type of the
            // base register as it will always be patched to ESP|RSP.
          }
          else {
            if (ASMJIT_UNLIKELY(!Support::bitTest(vd->allowedMemBaseRegs, baseType)))
              return DebugUtils::errored(kErrorInvalidAddress);
          }

          // Create information that will be validated only if this is an implicit memory operand. Basically
          // only usable for string instructions and other instructions where memory operand is implicit and
          // has 'seg:[reg]' form.
          if (baseId < Operand::kVirtIdMin) {
            if (ASMJIT_UNLIKELY(baseId >= 32))
              return DebugUtils::errored(kErrorInvalidPhysId);

            // Physical base id.
            regMask = Support::bitMask(baseId);
            combinedRegMask |= regMask;
          }
          else {
            // Virtual base id - fill the whole mask for implicit mem validation. The register is not assigned
            // yet, so we cannot predict the phys id.
            if (uint32_t(validationFlags & ValidationFlags::kEnableVirtRegs) == 0)
              return DebugUtils::errored(kErrorIllegalVirtReg);
            regMask = 0xFFFFFFFFu;
          }

          if (indexType == RegType::kNone && !m.offsetLo32())
            opFlags |= InstDB::OpFlags::kFlagMemBase;
        }
        else if (baseType == RegType::kLabelTag) {
          // [Label] - there is no need to validate the base as it's label.
        }
        else {
          // Base is a 64-bit address.
          int64_t offset = m.offset();
          if (!Support::isInt32(offset)) {
            if (mode == InstDB::Mode::kX86) {
              // 32-bit mode: Make sure that the address is either `int32_t` or `uint32_t`.
              if (!Support::isUInt32(offset))
                return DebugUtils::errored(kErrorInvalidAddress64Bit);
            }
            else {
              // 64-bit mode: Zero extension is allowed if the address has 32-bit index register or the address
              // has no index register (it's still encodable).
              if (indexType != RegType::kNone) {
                if (!Support::isUInt32(offset))
                  return DebugUtils::errored(kErrorInvalidAddress64Bit);

                if (indexType != RegType::kX86_Gpd)
                  return DebugUtils::errored(kErrorInvalidAddress64BitZeroExtension);
              }
              else {
                // We don't validate absolute 64-bit addresses without an index register as this also depends
                // on the target's base address. We don't have the information to do it at this moment.
              }
            }
          }
        }

        if (indexType != RegType::kNone) {
          if (ASMJIT_UNLIKELY(!Support::bitTest(vd->allowedMemIndexRegs, indexType)))
            return DebugUtils::errored(kErrorInvalidAddress);

          if (indexType == RegType::kX86_Xmm) {
            opFlags |= InstDB::OpFlags::kVm32x | InstDB::OpFlags::kVm64x;
          }
          else if (indexType == RegType::kX86_Ymm) {
            opFlags |= InstDB::OpFlags::kVm32y | InstDB::OpFlags::kVm64y;
          }
          else if (indexType == RegType::kX86_Zmm) {
            opFlags |= InstDB::OpFlags::kVm32z | InstDB::OpFlags::kVm64z;
          }
          else {
            if (baseType != RegType::kNone)
              opFlags |= InstDB::OpFlags::kFlagMib;
          }

          // [RIP + {XMM|YMM|ZMM}] is not allowed.
          if (baseType == RegType::kX86_Rip && Support::test(opFlags, InstDB::OpFlags::kVmMask))
            return DebugUtils::errored(kErrorInvalidAddress);

          uint32_t indexId = m.indexId();
          if (indexId < Operand::kVirtIdMin) {
            if (ASMJIT_UNLIKELY(indexId >= 32))
              return DebugUtils::errored(kErrorInvalidPhysId);

            combinedRegMask |= Support::bitMask(indexId);
          }
          else {
            if (uint32_t(validationFlags & ValidationFlags::kEnableVirtRegs) == 0)
              return DebugUtils::errored(kErrorIllegalVirtReg);
          }

          // Only used for implicit memory operands having 'seg:[reg]' form, so clear it.
          regMask = 0;
        }

        switch (memSize) {
          case  0: opFlags |= InstDB::OpFlags::kMemUnspecified; break;
          case  1: opFlags |= InstDB::OpFlags::kMem8; break;
          case  2: opFlags |= InstDB::OpFlags::kMem16; break;
          case  4: opFlags |= InstDB::OpFlags::kMem32; break;
          case  6: opFlags |= InstDB::OpFlags::kMem48; break;
          case  8: opFlags |= InstDB::OpFlags::kMem64; break;
          case 10: opFlags |= InstDB::OpFlags::kMem80; break;
          case 16: opFlags |= InstDB::OpFlags::kMem128; break;
          case 32: opFlags |= InstDB::OpFlags::kMem256; break;
          case 64: opFlags |= InstDB::OpFlags::kMem512; break;

          default:
            return DebugUtils::errored(kErrorInvalidOperandSize);
        }

        break;
      }

      case OperandType::kImm: {
        uint64_t immValue = op.as<Imm>().valueAs<uint64_t>();

        if (int64_t(immValue) >= 0) {
          if (immValue <= 0x7u)
            opFlags = InstDB::OpFlags::kImmI64 | InstDB::OpFlags::kImmU64 | InstDB::OpFlags::kImmI32 | InstDB::OpFlags::kImmU32 |
                      InstDB::OpFlags::kImmI16 | InstDB::OpFlags::kImmU16 | InstDB::OpFlags::kImmI8  | InstDB::OpFlags::kImmU8  |
                      InstDB::OpFlags::kImmI4  | InstDB::OpFlags::kImmU4  ;
          else if (immValue <= 0xFu)
            opFlags = InstDB::OpFlags::kImmI64 | InstDB::OpFlags::kImmU64 | InstDB::OpFlags::kImmI32 | InstDB::OpFlags::kImmU32 |
                      InstDB::OpFlags::kImmI16 | InstDB::OpFlags::kImmU16 | InstDB::OpFlags::kImmI8  | InstDB::OpFlags::kImmU8  |
                      InstDB::OpFlags::kImmU4  ;
          else if (immValue <= 0x7Fu)
            opFlags = InstDB::OpFlags::kImmI64 | InstDB::OpFlags::kImmU64 | InstDB::OpFlags::kImmI32 | InstDB::OpFlags::kImmU32 |
                      InstDB::OpFlags::kImmI16 | InstDB::OpFlags::kImmU16 | InstDB::OpFlags::kImmI8  | InstDB::OpFlags::kImmU8  ;
          else if (immValue <= 0xFFu)
            opFlags = InstDB::OpFlags::kImmI64 | InstDB::OpFlags::kImmU64 | InstDB::OpFlags::kImmI32 | InstDB::OpFlags::kImmU32 |
                      InstDB::OpFlags::kImmI16 | InstDB::OpFlags::kImmU16 | InstDB::OpFlags::kImmU8  ;
          else if (immValue <= 0x7FFFu)
            opFlags = InstDB::OpFlags::kImmI64 | InstDB::OpFlags::kImmU64 | InstDB::OpFlags::kImmI32 | InstDB::OpFlags::kImmU32 |
                      InstDB::OpFlags::kImmI16 | InstDB::OpFlags::kImmU16 ;
          else if (immValue <= 0xFFFFu)
            opFlags = InstDB::OpFlags::kImmI64 | InstDB::OpFlags::kImmU64 | InstDB::OpFlags::kImmI32 | InstDB::OpFlags::kImmU32 |
                      InstDB::OpFlags::kImmU16 ;
          else if (immValue <= 0x7FFFFFFFu)
            opFlags = InstDB::OpFlags::kImmI64 | InstDB::OpFlags::kImmU64 | InstDB::OpFlags::kImmI32 | InstDB::OpFlags::kImmU32;
          else if (immValue <= 0xFFFFFFFFu)
            opFlags = InstDB::OpFlags::kImmI64 | InstDB::OpFlags::kImmU64 | InstDB::OpFlags::kImmU32;
          else if (immValue <= 0x7FFFFFFFFFFFFFFFu)
            opFlags = InstDB::OpFlags::kImmI64 | InstDB::OpFlags::kImmU64;
          else
            opFlags = InstDB::OpFlags::kImmU64;
        }
        else {
          immValue = Support::neg(immValue);
          if (immValue <= 0x8u)
            opFlags = InstDB::OpFlags::kImmI64 | InstDB::OpFlags::kImmI32 | InstDB::OpFlags::kImmI16 | InstDB::OpFlags::kImmI8 | InstDB::OpFlags::kImmI4;
          else if (immValue <= 0x80u)
            opFlags = InstDB::OpFlags::kImmI64 | InstDB::OpFlags::kImmI32 | InstDB::OpFlags::kImmI16 | InstDB::OpFlags::kImmI8;
          else if (immValue <= 0x8000u)
            opFlags = InstDB::OpFlags::kImmI64 | InstDB::OpFlags::kImmI32 | InstDB::OpFlags::kImmI16;
          else if (immValue <= 0x80000000u)
            opFlags = InstDB::OpFlags::kImmI64 | InstDB::OpFlags::kImmI32;
          else
            opFlags = InstDB::OpFlags::kImmI64;
        }
        break;
      }

      case OperandType::kLabel: {
        opFlags |= InstDB::OpFlags::kRel8 | InstDB::OpFlags::kRel32;
        break;
      }

      default:
        return DebugUtils::errored(kErrorInvalidState);
    }

    InstDB::OpSignature& oSigDst = oSigTranslated[i];
    oSigDst._flags = uint64_t(opFlags) & 0x00FFFFFFFFFFFFFFu;
    oSigDst._regMask = uint8_t(regMask & 0xFFu);
    combinedOpFlags |= opFlags;
  }

  // Decrease the number of operands of those that are none. This is important as Assembler and Compiler may just pass
  // more operands padded with none (which means that no operand is given at that index). However, validate that there
  // are no gaps (like [reg, none, reg] or [none, reg]).
  if (i < opCount) {
    while (--opCount > i)
      if (ASMJIT_UNLIKELY(!operands[opCount].isNone()))
        return DebugUtils::errored(kErrorInvalidInstruction);
  }

  // Validate X86 and X64 specific cases.
  if (mode == InstDB::Mode::kX86) {
    // Illegal use of 64-bit register in 32-bit mode.
    if (ASMJIT_UNLIKELY(Support::test(combinedOpFlags, InstDB::OpFlags::kRegGpq)))
      return DebugUtils::errored(kErrorInvalidUseOfGpq);
  }
  else {
    // Illegal use of a high 8-bit register with REX prefix.
    bool hasREX = inst.hasOption(InstOptions::kX86_Rex) || (combinedRegMask & 0xFFFFFF00u) != 0;
    if (ASMJIT_UNLIKELY(hasREX && Support::test(combinedOpFlags, InstDB::OpFlags::kRegGpbHi)))
      return DebugUtils::errored(kErrorInvalidUseOfGpbHi);
  }

  // Validate Instruction Signature by Comparing Against All `iSig` Rows
  // -------------------------------------------------------------------

  const InstDB::InstSignature* iSig = InstDB::_instSignatureTable + commonInfo._iSignatureIndex;
  const InstDB::InstSignature* iEnd = iSig + commonInfo._iSignatureCount;

  if (iSig != iEnd) {
    const InstDB::OpSignature* opSignatureTable = InstDB::_opSignatureTable;

    // If set it means that we matched a signature where only immediate value
    // was out of bounds. We can return a more descriptive error if we know this.
    bool globalImmOutOfRange = false;

    do {
      // Check if the architecture is compatible.
      if (!iSig->supportsMode(mode))
        continue;

      // Compare the operands table with reference operands.
      uint32_t j = 0;
      uint32_t iSigCount = iSig->opCount();
      bool localImmOutOfRange = false;

      if (iSigCount == opCount) {
        for (j = 0; j < opCount; j++)
          if (!x86CheckOSig(oSigTranslated[j], iSig->opSignature(j), localImmOutOfRange))
            break;
      }
      else if (iSigCount - iSig->implicitOpCount() == opCount) {
        uint32_t r = 0;
        for (j = 0; j < opCount && r < iSigCount; j++, r++) {
          const InstDB::OpSignature* oChk = oSigTranslated + j;
          const InstDB::OpSignature* oRef;
Next:
          oRef = opSignatureTable + iSig->opSignatureIndex(r);
          // Skip implicit operands.
          if (oRef->isImplicit()) {
            if (++r >= iSigCount)
              break;
            else
              goto Next;
          }

          if (!x86CheckOSig(*oChk, *oRef, localImmOutOfRange))
            break;
        }
      }

      if (j == opCount) {
        if (!localImmOutOfRange) {
          // Match, must clear possible `globalImmOutOfRange`.
          globalImmOutOfRange = false;
          break;
        }
        globalImmOutOfRange = localImmOutOfRange;
      }
    } while (++iSig != iEnd);

    if (iSig == iEnd) {
      if (globalImmOutOfRange)
        return DebugUtils::errored(kErrorInvalidImmediate);
      else
        return DebugUtils::errored(kErrorInvalidInstruction);
    }
  }

  // Validate AVX512 Options
  // -----------------------

  const RegOnly& extraReg = inst.extraReg();

  if (Support::test(options, kAvx512Options)) {
    if (commonInfo.hasFlag(InstDB::InstFlags::kEvex)) {
      // Validate AVX-512 {z}.
      if (Support::test(options, InstOptions::kX86_ZMask)) {
        if (ASMJIT_UNLIKELY(Support::test(options, InstOptions::kX86_ZMask) && !commonInfo.hasAvx512Z()))
          return DebugUtils::errored(kErrorInvalidKZeroUse);
      }

      // Validate AVX-512 {sae} and {er}.
      if (Support::test(options, InstOptions::kX86_SAE | InstOptions::kX86_ER)) {
        // Rounding control is impossible if the instruction is not reg-to-reg.
        if (ASMJIT_UNLIKELY(memOp))
          return DebugUtils::errored(kErrorInvalidEROrSAE);

        // Check if {sae} or {er} is supported by the instruction.
        if (Support::test(options, InstOptions::kX86_ER)) {
          // NOTE: if both {sae} and {er} are set, we don't care, as {sae} is implied.
          if (ASMJIT_UNLIKELY(!commonInfo.hasAvx512ER()))
            return DebugUtils::errored(kErrorInvalidEROrSAE);
        }
        else {
          if (ASMJIT_UNLIKELY(!commonInfo.hasAvx512SAE()))
            return DebugUtils::errored(kErrorInvalidEROrSAE);
        }

        // {sae} and {er} are defined for either scalar ops or vector ops that require LL to be 10 (512-bit vector
        // operations). We don't need any more bits in the instruction database to be able to validate this, as
        // each AVX512 instruction that has broadcast is vector instruction (in this case we require zmm registers),
        // otherwise it's a scalar instruction, which is valid.
        if (commonInfo.hasAvx512B()) {
          // Supports broadcast, thus we require LL to be '10', which means there have to be ZMM registers used. We
          // don't calculate LL here, but we know that it would be '10' if there is at least one ZMM register used.

          // There is no {er}/{sae}-enabled instruction with less than two operands.
          ASMJIT_ASSERT(opCount >= 2);
          if (ASMJIT_UNLIKELY(!x86IsZmmOrM512(operands[0]) && !x86IsZmmOrM512(operands[1])))
            return DebugUtils::errored(kErrorInvalidEROrSAE);
        }
      }
    }
    else {
      // Not an AVX512 instruction - maybe OpExtra is xCX register used by REP/REPNE prefix.
      if (Support::test(options, kAvx512Options) || !Support::test(options, kRepAny))
        return DebugUtils::errored(kErrorInvalidInstruction);
    }
  }

  // Validate {Extra} Register
  // -------------------------

  if (extraReg.isReg()) {
    if (Support::test(options, kRepAny)) {
      // Validate REP|REPNE {cx|ecx|rcx}.
      if (ASMJIT_UNLIKELY(Support::test(iFlags, InstDB::InstFlags::kRepIgnored)))
        return DebugUtils::errored(kErrorInvalidExtraReg);

      if (extraReg.isPhysReg()) {
        if (ASMJIT_UNLIKELY(extraReg.id() != Gp::kIdCx))
          return DebugUtils::errored(kErrorInvalidExtraReg);
      }

      // The type of the {...} register must match the type of the base register
      // of memory operand. So if the memory operand uses 32-bit register the
      // count register must also be 32-bit, etc...
      if (ASMJIT_UNLIKELY(!memOp || extraReg.type() != memOp->baseType()))
        return DebugUtils::errored(kErrorInvalidExtraReg);
    }
    else if (commonInfo.hasFlag(InstDB::InstFlags::kEvex)) {
      // Validate AVX-512 {k}.
      if (ASMJIT_UNLIKELY(extraReg.type() != RegType::kX86_KReg))
        return DebugUtils::errored(kErrorInvalidExtraReg);

      if (ASMJIT_UNLIKELY(extraReg.id() == 0 || !commonInfo.hasAvx512K()))
        return DebugUtils::errored(kErrorInvalidKMaskUse);
    }
    else {
      return DebugUtils::errored(kErrorInvalidExtraReg);
    }
  }

  return kErrorOk;
}